

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_type.hpp
# Opt level: O3

string * cpptrace::detail::exception_type_name_abi_cxx11_(void)

{
  long lVar1;
  string *in_RDI;
  allocator<char> local_31;
  string local_30;
  
  lVar1 = __cxa_current_exception_type();
  if (lVar1 == 0) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    std::__cxx11::string::_M_construct<char_const*>();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,*(char **)(lVar1 + 8) + (**(char **)(lVar1 + 8) == '*'),&local_31
              );
    demangle(in_RDI,&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return in_RDI;
}

Assistant:

inline std::string exception_type_name() {
        #if defined(CPPTRACE_HAS_CXX_EXCEPTION_TYPE) && (IS_LIBSTDCXX || IS_LIBCXX)
         const std::type_info* t = abi::__cxa_current_exception_type();
         return t ? detail::demangle(t->name()) : "<unknown>";
        #else
         return "<unknown>";
        #endif
    }